

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,wchar_t *msg)

{
  Logger *pLVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  undefined1 *puVar5;
  
  if (msg == (wchar_t *)0x0) {
    pLVar1 = this->m_logger;
    pcVar2 = "nullptr";
    lVar4 = 7;
  }
  else {
    pcVar2 = utils::Str::wcharPtrToCharPtr(msg);
    puVar5 = &this->m_logger->field_0x50;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)puVar5 + (int)*(undefined8 *)(*(long *)puVar5 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar5,pcVar2,sVar3);
    }
    free(pcVar2);
    if ((*(byte *)(elStorage + 0x19) & 0x20) == 0) {
      return this;
    }
    pLVar1 = this->m_logger;
    pcVar2 = " ";
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pLVar1->field_0x50,pcVar2,lVar4);
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator<<(const wchar_t* msg) {
  if (msg == nullptr) {
    m_logger->stream() << base::consts::kNullPointer;
    return *this;
  }
#  if defined(ELPP_UNICODE)
  m_logger->stream() << msg;
#  else
  char* buff_ = base::utils::Str::wcharPtrToCharPtr(msg);
  m_logger->stream() << buff_;
  free(buff_);
#  endif
  if (ELPP->hasFlag(LoggingFlag::AutoSpacing)) {
    m_logger->stream() << " ";
  }
  return *this;
}